

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

char * fmt::v9::detail::
       parse_width<char,fmt::v9::detail::specs_checker<fmt::v9::detail::specs_handler<char>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v9::detail::specs_handler<char>_> *handler)

{
  int width_00;
  specs_setter<char> *in_RDX;
  width_adapter *in_RSI;
  width_adapter *in_RDI;
  int width;
  char c;
  specs_setter<char> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  char *in_stack_fffffffffffffff8;
  
  if (in_RDI != in_RSI) {
    if ((*(char *)&in_RDI->handler < '0') || ('9' < *(char *)&in_RDI->handler)) {
      if (*(char *)&in_RDI->handler == '{') {
        in_RDI = (width_adapter *)((long)&in_RDI->handler + 1);
        if (in_RDI != in_RSI) {
          if ((*(char *)&in_RDI->handler == '}') || (*(char *)&in_RDI->handler == ':')) {
            parse_width<char,_fmt::v9::detail::specs_checker<fmt::v9::detail::specs_handler<char>_>_&>
            ::width_adapter::operator()
                      ((width_adapter *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
            in_stack_ffffffffffffffa8 = in_RDX;
          }
          else {
            in_RDI = (width_adapter *)
                     do_parse_arg_id<char,fmt::v9::detail::parse_width<char,fmt::v9::detail::specs_checker<fmt::v9::detail::specs_handler<char>>&>(char_const*,char_const*,fmt::v9::detail::specs_checker<fmt::v9::detail::specs_handler<char>>&)::width_adapter&>
                               (in_stack_fffffffffffffff8,(char *)in_RDI,in_RSI);
            in_stack_ffffffffffffffa8 = in_RDX;
          }
        }
        if ((in_RDI == in_RSI) || (*(char *)&in_RDI->handler != '}')) {
          specs_handler<char>::on_error
                    ((specs_handler<char> *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (char *)in_stack_ffffffffffffffa8);
        }
        else {
          in_RDI = (width_adapter *)((long)&in_RDI->handler + 1);
        }
      }
    }
    else {
      width_00 = parse_nonnegative_int<char>
                           ((char **)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                            in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20));
      if (width_00 == -1) {
        specs_handler<char>::on_error
                  ((specs_handler<char> *)CONCAT44(0xffffffff,in_stack_ffffffffffffffb0),
                   (char *)in_stack_ffffffffffffffa8);
      }
      else {
        specs_setter<char>::on_width(in_RDX,width_00);
      }
    }
    return (char *)in_RDI;
  }
  assert_fail((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
              (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(char *)0x1d1b29);
}

Assistant:

FMT_CONSTEXPR auto parse_width(const Char* begin, const Char* end,
                               Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct width_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_width(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_width(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_width(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    int width = parse_nonnegative_int(begin, end, -1);
    if (width != -1)
      handler.on_width(width);
    else
      handler.on_error("number is too big");
  } else if (*begin == '{') {
    ++begin;
    if (begin != end) begin = parse_arg_id(begin, end, width_adapter{handler});
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}